

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O0

void generate_flux(TrackData *trackdata)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  value_type *__x;
  int local_a0;
  undefined1 local_80 [12];
  int pre_comp_ns;
  uint8_t next_bit;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  undefined1 auStack_48 [8];
  FluxData flux_data;
  undefined1 local_28 [8];
  uint32_t flux_time;
  int ns_per_bitcell;
  BitBuffer *bitbuf;
  uint8_t curr_bit;
  TrackData *pTStack_10;
  uint8_t last_bit;
  TrackData *trackdata_local;
  
  bitbuf._7_1_ = '\0';
  bitbuf._6_1_ = '\0';
  pTStack_10 = trackdata;
  _flux_time = TrackData::bitstream(trackdata);
  local_28._4_4_ = bitcell_ns(_flux_time->datarate);
  BitBuffer::seek(_flux_time,0);
  local_28._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  flux_data.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  flux_data.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)auStack_48);
  auStack_68 = (undefined1  [8])0x0;
  flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
  iVar2 = BitBuffer::size(_flux_time);
  __x = (value_type *)(long)iVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,(size_type)__x);
  while (bVar1 = BitBuffer::wrapped(_flux_time), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_80[0xb] = BitBuffer::read1(_flux_time);
    local_28._0_4_ = local_28._4_4_ + local_28._0_4_;
    iVar2 = extraout_EDX;
    if (bitbuf._6_1_ != '\0') {
      if ((pTStack_10->cylhead).cyl < 0x28) {
        __x = (value_type *)local_28;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                   (value_type_conflict2 *)__x);
        local_28._0_4_ = 0;
        iVar2 = extraout_EDX_00;
      }
      else {
        if (bitbuf._7_1_ == local_80[0xb]) {
          local_a0 = 0;
        }
        else {
          local_a0 = -0xf0;
          if (bitbuf._7_1_ != '\0') {
            local_a0 = 0xf0;
          }
        }
        local_80._4_4_ = local_a0;
        local_80._0_4_ = local_28._0_4_ + local_a0;
        __x = (value_type *)local_80;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                   (value_type_conflict2 *)__x);
        local_28._0_4_ = -local_80._4_4_;
        iVar2 = extraout_EDX_01;
      }
    }
    bitbuf._7_1_ = bitbuf._6_1_;
    bitbuf._6_1_ = local_80[0xb];
    pcVar3 = BitBuffer::index(_flux_time,(char *)__x,iVar2);
    if (((ulong)pcVar3 & 1) != 0) {
      __x = (value_type *)auStack_68;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)auStack_48,__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
    }
  }
  bVar1 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::empty((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)auStack_48);
  if ((bVar1) ||
     (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68), !bVar1)
     ) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)auStack_48,(value_type *)auStack_68);
  }
  TrackData::add(pTStack_10,(FluxData *)auStack_48,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_48);
  return;
}

Assistant:

void generate_flux(TrackData& trackdata)
{
    uint8_t last_bit{ 0 }, curr_bit{ 0 };
    auto& bitbuf = trackdata.bitstream();
    auto ns_per_bitcell = bitcell_ns(bitbuf.datarate);
    bitbuf.seek(0);

    uint32_t flux_time{ 0 };
    FluxData flux_data{};
    std::vector<uint32_t> flux_times{};
    flux_times.reserve(bitbuf.size());

    while (!bitbuf.wrapped())
    {
        auto next_bit{ bitbuf.read1() };

        flux_time += ns_per_bitcell;
        if (curr_bit)
        {
            if (trackdata.cylhead.cyl < 40)
            {
                flux_times.push_back(flux_time);
                flux_time = 0;
            }
            else
            {
                auto pre_comp_ns{ (last_bit == next_bit) ? 0 : (last_bit ? +240 : -240) };
                flux_times.push_back(flux_time + pre_comp_ns);
                flux_time = 0 - pre_comp_ns;
            }
        }

        last_bit = curr_bit;
        curr_bit = next_bit;

        if (bitbuf.index())
        {
            flux_data.push_back(std::move(flux_times));
            flux_times.clear();
        }
    }

    if (flux_data.empty() || !flux_times.empty())
        flux_data.push_back(std::move(flux_times));

    trackdata.add(std::move(flux_data), true);
}